

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodecompile.cc
# Opt level: O0

ExprTree * __thiscall
PcodeCompile::createOpOut
          (PcodeCompile *this,VarnodeTpl *outvn,OpCode opc,ExprTree *vn1,ExprTree *vn2)

{
  vector<OpTpl*,std::allocator<OpTpl*>> *this_00;
  ExprTree *pEVar1;
  OpTpl *this_01;
  VarnodeTpl *this_02;
  OpTpl *local_60;
  OpTpl *op;
  OpTpl **local_50;
  __normal_iterator<OpTpl_**,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_> local_48;
  __normal_iterator<OpTpl_**,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_> local_40;
  const_iterator local_38;
  ExprTree *local_30;
  ExprTree *vn2_local;
  ExprTree *vn1_local;
  VarnodeTpl *pVStack_18;
  OpCode opc_local;
  VarnodeTpl *outvn_local;
  PcodeCompile *this_local;
  
  this_00 = (vector<OpTpl*,std::allocator<OpTpl*>> *)vn1->ops;
  local_30 = vn2;
  vn2_local = vn1;
  vn1_local._4_4_ = opc;
  pVStack_18 = outvn;
  outvn_local = (VarnodeTpl *)this;
  local_40._M_current =
       (OpTpl **)
       std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::end
                 ((vector<OpTpl_*,_std::allocator<OpTpl_*>_> *)this_00);
  __gnu_cxx::__normal_iterator<OpTpl*const*,std::vector<OpTpl*,std::allocator<OpTpl*>>>::
  __normal_iterator<OpTpl**>
            ((__normal_iterator<OpTpl*const*,std::vector<OpTpl*,std::allocator<OpTpl*>>> *)&local_38
             ,&local_40);
  local_48._M_current =
       (OpTpl **)std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::begin(local_30->ops);
  local_50 = (OpTpl **)std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::end(local_30->ops);
  op = (OpTpl *)std::vector<OpTpl*,std::allocator<OpTpl*>>::
                insert<__gnu_cxx::__normal_iterator<OpTpl**,std::vector<OpTpl*,std::allocator<OpTpl*>>>,void>
                          (this_00,local_38,local_48,
                           (__normal_iterator<OpTpl_**,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_>
                            )local_50);
  std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::clear(local_30->ops);
  this_01 = (OpTpl *)operator_new(0x28);
  OpTpl::OpTpl(this_01,vn1_local._4_4_);
  local_60 = this_01;
  OpTpl::addInput(this_01,vn2_local->outvn);
  OpTpl::addInput(local_60,local_30->outvn);
  local_30->outvn = (VarnodeTpl *)0x0;
  OpTpl::setOutput(local_60,pVStack_18);
  std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::push_back(vn2_local->ops,&local_60);
  this_02 = (VarnodeTpl *)operator_new(0x68);
  VarnodeTpl::VarnodeTpl(this_02,pVStack_18);
  pEVar1 = local_30;
  vn2_local->outvn = this_02;
  if (local_30 != (ExprTree *)0x0) {
    ExprTree::~ExprTree(local_30);
    operator_delete(pEVar1);
  }
  return vn2_local;
}

Assistant:

ExprTree *PcodeCompile::createOpOut(VarnodeTpl *outvn,OpCode opc,
				       ExprTree *vn1,ExprTree *vn2)
{ // Create an op with explicit output and two inputs
  vn1->ops->insert(vn1->ops->end(),vn2->ops->begin(),vn2->ops->end());
  vn2->ops->clear();
  OpTpl *op = new OpTpl(opc);
  op->addInput(vn1->outvn);
  op->addInput(vn2->outvn);
  vn2->outvn = (VarnodeTpl *)0;
  op->setOutput(outvn);
  vn1->ops->push_back(op);
  vn1->outvn = new VarnodeTpl(*outvn);
  delete vn2;
  return vn1;
}